

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void wr_monster(monster *mon)

{
  object *local_28;
  object *dummy;
  object *obj;
  size_t j;
  monster *mon_local;
  
  dummy = mon->held_obj;
  j = (size_t)mon;
  local_28 = object_new();
  wr_u16b((uint16_t)*(undefined4 *)(j + 0x20));
  wr_string(*(char **)(*(long *)j + 0x10));
  if (*(long *)(j + 8) == 0) {
    wr_string("none");
  }
  else {
    wr_string(*(char **)(*(long *)(j + 8) + 0x10));
  }
  if (*(long *)(j + 0x10) == 0) {
    wr_string("none");
  }
  else {
    wr_string(*(char **)(*(long *)(j + 0x10) + 8));
  }
  if (*(long *)(j + 0x18) == 0) {
    wr_string("none");
  }
  else {
    wr_string(*(char **)(*(long *)(j + 0x18) + 8));
  }
  wr_byte((uint8_t)*(undefined4 *)(j + 0x28));
  wr_byte((uint8_t)*(undefined4 *)(j + 0x24));
  wr_s16b(*(int16_t *)(j + 0x2c));
  wr_s16b(*(int16_t *)(j + 0x2e));
  wr_byte(*(uint8_t *)(j + 0x44));
  wr_byte(*(uint8_t *)(j + 0x45));
  wr_byte((uint8_t)*(undefined4 *)(j + 0x1a4));
  wr_byte((uint8_t)*(undefined4 *)(j + 0x1a0));
  wr_s16b((int16_t)*(undefined4 *)(j + 0x1a8));
  wr_byte((uint8_t)*(undefined4 *)(j + 0x1b0));
  wr_byte((uint8_t)*(undefined4 *)(j + 0x1ac));
  wr_byte('\n');
  for (obj = (object *)0x0; obj < (object *)0xa; obj = (object *)((long)&obj->kind + 1)) {
    wr_s16b(*(int16_t *)(j + 0x30 + (long)obj * 2));
  }
  for (obj = (object *)0x0; obj < (object *)0x2; obj = (object *)((long)&obj->kind + 1)) {
    wr_byte(obj->flags[j - 5]);
  }
  for (obj = (object *)0x0; obj < (object *)0x6; obj = (object *)((long)&obj->kind + 1)) {
    wr_byte(*(uint8_t *)((long)&(obj->time).dice + j + 1));
  }
  for (obj = (object *)0x0; obj < (object *)0x1c; obj = (object *)((long)&obj->kind + 1)) {
    wr_s16b(*(int16_t *)(j + 0x12e + (long)obj * 4));
  }
  if (*(long *)(j + 0x50) == 0) {
    wr_u16b(0);
  }
  else {
    wr_u16b((uint16_t)*(undefined4 *)(j + 0x20));
  }
  for (; dummy != (object *)0x0; dummy = dummy->next) {
    wr_item(dummy);
  }
  wr_item(local_28);
  object_delete((chunk *)0x0,(chunk *)0x0,&local_28);
  wr_u16b((uint16_t)*(undefined4 *)(j + 0x1b8));
  wr_byte((uint8_t)*(undefined4 *)(j + 0x1bc));
  wr_u16b((uint16_t)*(undefined4 *)(j + 0x1c8));
  wr_byte((uint8_t)*(undefined4 *)(j + 0x1cc));
  return;
}

Assistant:

static void wr_monster(const struct monster *mon)
{
	size_t j;
	struct object *obj = mon->held_obj; 
	struct object *dummy = object_new();

	wr_u16b(mon->midx);
	wr_string(mon->race->name);
	if (mon->original_race) {
		wr_string(mon->original_race->name);
	} else {
		wr_string("none");
	}
	if (mon->player_race) {
		wr_string(mon->player_race->name);
	} else {
		wr_string("none");
	}
	if (mon->original_player_race) {
		wr_string(mon->original_player_race->name);
	} else {
		wr_string("none");
	}
	wr_byte(mon->grid.y);
	wr_byte(mon->grid.x);
	wr_s16b(mon->hp);
	wr_s16b(mon->maxhp);
	wr_byte(mon->mspeed);
	wr_byte(mon->energy);
	wr_byte(mon->target.grid.y);
	wr_byte(mon->target.grid.x);
	wr_s16b(mon->target.midx);
	wr_byte(mon->home.y);
	wr_byte(mon->home.x);
	wr_byte(MON_TMD_MAX);

	for (j = 0; j < MON_TMD_MAX; j++)
		wr_s16b(mon->m_timed[j]);

	for (j = 0; j < MFLAG_SIZE; j++)
		wr_byte(mon->mflag[j]);

	for (j = 0; j < OF_SIZE; j++)
		wr_byte(mon->known_pstate.flags[j]);

	for (j = 0; j < ELEM_MAX; j++)
		wr_s16b(mon->known_pstate.el_info[j].res_level);

	/* Write mimicked object marker, if any */
	if (mon->mimicked_obj) {
		wr_u16b(mon->midx);
	} else
		wr_u16b(0);

	/* Write all held objects, followed by a dummy as a marker */
	while (obj) {
		wr_item(obj);
		obj = obj->next;
	}
	wr_item(dummy);
	object_delete(NULL, NULL, &dummy);

	/* Write group info */
	wr_u16b(mon->group_info[PRIMARY_GROUP].index);
	wr_byte(mon->group_info[PRIMARY_GROUP].role);
	wr_u16b(mon->group_info[SUMMON_GROUP].index);
	wr_byte(mon->group_info[SUMMON_GROUP].role);
}